

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Dimension::MergeFrom(Dimension *this,Dimension *from)

{
  DimensionCase DVar1;
  LogMessage *other;
  Dimension_ConstantDimension *this_00;
  Dimension_ConstantDimension *from_00;
  Dimension_UnknownDimension *this_01;
  Dimension_UnknownDimension *from_01;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  Dimension *local_18;
  Dimension *from_local;
  Dimension *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
               ,0x1406);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  DVar1 = dimension_case(local_18);
  if (DVar1 != DIMENSION_NOT_SET) {
    if (DVar1 == kConstant) {
      this_00 = _internal_mutable_constant(this);
      from_00 = _internal_constant(local_18);
      Dimension_ConstantDimension::MergeFrom(this_00,from_00);
    }
    else if (DVar1 == kUnknown) {
      this_01 = _internal_mutable_unknown(this);
      from_01 = _internal_unknown(local_18);
      Dimension_UnknownDimension::MergeFrom(this_01,from_01);
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Dimension::MergeFrom(const Dimension& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Dimension)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.dimension_case()) {
    case kConstant: {
      _internal_mutable_constant()->::CoreML::Specification::MILSpec::Dimension_ConstantDimension::MergeFrom(from._internal_constant());
      break;
    }
    case kUnknown: {
      _internal_mutable_unknown()->::CoreML::Specification::MILSpec::Dimension_UnknownDimension::MergeFrom(from._internal_unknown());
      break;
    }
    case DIMENSION_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}